

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
* google::protobuf::compiler::cpp::anon_unknown_0::SortFieldsByNumber
            (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *__return_storage_ptr__,Descriptor *descriptor)

{
  int iVar1;
  int iVar2;
  pointer ppFVar3;
  FieldDescriptor *pFVar4;
  FieldDescriptor *pFVar5;
  ulong uVar6;
  long lVar7;
  pointer ppFVar8;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  pointer ppFVar9;
  allocator_type local_21;
  
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(__return_storage_ptr__,(long)*(int *)(descriptor + 4),&local_21);
  iVar1 = *(int *)(descriptor + 4);
  if (0 < (long)iVar1) {
    lVar7 = 0;
    do {
      (__return_storage_ptr__->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_start[lVar7] =
           (FieldDescriptor *)(lVar7 * 0x48 + *(long *)(descriptor + 0x28));
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  ppFVar8 = (__return_storage_ptr__->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = (__return_storage_ptr__->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar8 != ppFVar3) {
    uVar6 = (long)ppFVar3 - (long)ppFVar8 >> 3;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
              (ppFVar8,ppFVar3,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppFVar3 - (long)ppFVar8 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar8,ppFVar3);
    }
    else {
      ppFVar9 = ppFVar8 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar8,ppFVar9);
      for (; ppFVar9 != ppFVar3; ppFVar9 = ppFVar9 + 1) {
        pFVar4 = ppFVar9[-1];
        pFVar5 = *ppFVar9;
        iVar2 = *(int *)(pFVar5 + 4);
        iVar1 = *(int *)(pFVar4 + 4);
        ppFVar8 = ppFVar9;
        while (iVar2 < iVar1) {
          *ppFVar8 = pFVar4;
          pFVar4 = ppFVar8[-2];
          ppFVar8 = ppFVar8 + -1;
          iVar1 = *(int *)(pFVar4 + 4);
        }
        *ppFVar8 = pFVar5;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const FieldDescriptor*> SortFieldsByNumber(
    const Descriptor* descriptor) {
  std::vector<const FieldDescriptor*> fields(descriptor->field_count());
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  std::sort(fields.begin(), fields.end(), FieldOrderingByNumber());
  return fields;
}